

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square_tm.hpp
# Opt level: O2

void ising::free_energy::square::transfer_matrix<double>::fill_D
               (uint_t Ly,real_t_conflict Jy,real_t_conflict beta,real_t_conflict h,
               vector<double,_std::allocator<double>_> *diag,
               vector<double,_std::allocator<double>_> *diag_10,
               vector<double,_std::allocator<double>_> *diag_20,
               vector<double,_std::allocator<double>_> *diag_01,
               vector<double,_std::allocator<double>_> *diag_02)

{
  ulong uVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  byte bVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  size_type sVar11;
  uint_t uVar12;
  uint_t uVar13;
  size_type __new_size;
  bool bVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  array<double,_2UL> weight;
  
  __new_size = (size_type)(1 << ((byte)Ly & 0x1f));
  std::vector<double,_std::allocator<double>_>::resize(diag,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(diag_10,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(diag_20,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(diag_01,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(diag_02,__new_size);
  pdVar2 = (diag->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (diag_10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (diag_20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (diag_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (diag_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (sVar11 = 0; __new_size != sVar11; sVar11 = sVar11 + 1) {
    pdVar2[sVar11] = 1.0;
    pdVar3[sVar11] = 1.0;
    pdVar4[sVar11] = 1.0;
    pdVar5[sVar11] = 1.0;
    pdVar6[sVar11] = 1.0;
  }
  weight.elems[0] = exp(Jy * beta);
  weight.elems[1] = exp(-beta * Jy);
  pdVar2 = (diag->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar10 = 0; uVar10 != __new_size; uVar10 = uVar10 + 1) {
    dVar15 = pdVar2[uVar10];
    uVar13 = 0;
    uVar12 = Ly;
    while (bVar14 = uVar12 != 0, uVar12 = uVar12 - 1, bVar14) {
      bVar7 = (byte)uVar13;
      uVar13 = uVar13 + 1;
      bVar8 = (byte)uVar13;
      if (uVar13 == Ly) {
        bVar8 = 0;
      }
      dVar15 = dVar15 * weight.elems
                        [((uint)(uVar10 >> (bVar8 & 0x3f)) ^ (uint)(uVar10 >> (bVar7 & 0x3f))) & 1];
    }
    pdVar2[uVar10] = dVar15;
  }
  weight.elems[0] = exp(beta * h);
  weight.elems[1] = exp(-beta * h);
  pdVar2 = (diag->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar10 = 0; uVar10 != __new_size; uVar10 = uVar10 + 1) {
    dVar15 = pdVar2[uVar10];
    for (uVar9 = 0; Ly != uVar9; uVar9 = uVar9 + 1) {
      dVar15 = dVar15 * weight.elems[(uVar10 >> (uVar9 & 0x3f) & 1) != 0];
    }
    pdVar2[uVar10] = dVar15;
  }
  pdVar3 = (diag_10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (diag_20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar10 = 0; uVar10 != __new_size; uVar10 = uVar10 + 1) {
    dVar15 = 0.0;
    uVar13 = Ly;
    uVar9 = 0;
    while (bVar14 = uVar13 != 0, uVar13 = uVar13 - 1, bVar14) {
      uVar1 = uVar9 + 1;
      dVar16 = (double)((uVar10 >> (uVar9 & 0x3f) & 1) != 0);
      uVar9 = uVar1 & 0xffffffff;
      if (uVar1 == Ly) {
        uVar9 = 0;
      }
      dVar17 = (double)((uVar10 >> (uVar9 & 0x3f) & 1) != 0);
      dVar15 = dVar15 + (1.0 - (dVar17 + dVar17)) * (1.0 - (dVar16 + dVar16)) * Jy;
      uVar9 = uVar1;
    }
    for (uVar9 = 0; Ly != uVar9; uVar9 = uVar9 + 1) {
      dVar16 = (double)((uVar10 >> (uVar9 & 0x3f) & 1) != 0);
      dVar15 = dVar15 + (1.0 - (dVar16 + dVar16)) * h;
    }
    pdVar3[uVar10] = pdVar2[uVar10] * dVar15;
    pdVar4[uVar10] = pdVar2[uVar10] * dVar15 * dVar15;
  }
  pdVar3 = (diag_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (diag_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar10 = 0; uVar10 != __new_size; uVar10 = uVar10 + 1) {
    dVar15 = 0.0;
    for (uVar9 = 0; Ly != uVar9; uVar9 = uVar9 + 1) {
      dVar16 = (double)((uVar10 >> (uVar9 & 0x3f) & 1) != 0);
      dVar15 = dVar15 + (1.0 - (dVar16 + dVar16)) * beta;
    }
    pdVar3[uVar10] = pdVar2[uVar10] * dVar15;
    pdVar4[uVar10] = pdVar2[uVar10] * dVar15 * dVar15;
  }
  return;
}

Assistant:

static void fill_D(uint_t Ly, real_t Jy, real_t beta, real_t h,
                     std::vector<real_t> &diag, std::vector<real_t> &diag_10,
                     std::vector<real_t> &diag_20, std::vector<real_t> &diag_01,
                     std::vector<real_t> &diag_02) {
    uint_t dim = 1 << Ly;
    diag.resize(dim);
    diag_10.resize(dim);
    diag_20.resize(dim);
    diag_01.resize(dim);
    diag_02.resize(dim);
    for (uint_t c = 0; c < dim; ++c) {
      diag[c] = 1;
      diag_10[c] = 1;
      diag_20[c] = 1;
      diag_01[c] = 1;
      diag_02[c] = 1;
    }
    boost::array<real_t, 2> weight;
    weight[0] = std::exp(beta * Jy);
    weight[1] = std::exp(-beta * Jy);
    for (uint_t c = 0; c < dim; ++c) {
      real_t elem = diag[c];
      for (uint_t b = 0; b < Ly; ++b) {
        uint_t s0 = b;
        uint_t s1 = (b + 1) % Ly;
        elem *= weight[((c >> s0) & 1) ^ ((c >> s1) & 1)];
      }
      diag[c] = elem;
    }
    weight[0] = std::exp(beta * h);
    weight[1] = std::exp(-beta * h);
    for (uint_t c = 0; c < dim; ++c) {
      real_t elem = diag[c];
      for (uint_t s = 0; s < Ly; ++s) {
        elem *= weight[((c >> s) & 1)];
      }
      diag[c] = elem;
    }
    for (uint_t c = 0; c < dim; ++c) {
      real_t factor = 0;
      for (uint_t b = 0; b < Ly; ++b) {
        uint_t s0 = b;
        uint_t s1 = (b + 1) % Ly;
        factor +=
            Jy * (-2.0 * ((c >> s0) & 1) + 1) * (-2.0 * ((c >> s1) & 1) + 1);
      }
      for (uint_t s = 0; s < Ly; ++s) {
        factor += h * (-2.0 * ((c >> s) & 1) + 1);
      }
      diag_10[c] = diag[c] * factor;
      diag_20[c] = diag[c] * factor * factor;
    }
    for (uint_t c = 0; c < dim; ++c) {
      real_t factor = 0;
      for (uint_t s = 0; s < Ly; ++s) {
        factor += beta * (-2.0 * ((c >> s) & 1) + 1);
      }
      diag_01[c] = diag[c] * factor;
      diag_02[c] = diag[c] * factor * factor;
    }
  }